

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O2

_Bool menu_calc_size(menu *menu)

{
  wchar_t wVar1;
  size_t sVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  region_conflict rVar6;
  
  rVar6.col = (menu->boundary).col;
  rVar6.row = (menu->boundary).row;
  rVar6.width = (menu->boundary).width;
  rVar6.page_rows = (menu->boundary).page_rows;
  rVar6 = region_calculate(rVar6);
  wVar5 = rVar6.col;
  wVar3 = rVar6.width;
  (menu->active).col = rVar6.col;
  (menu->active).row = rVar6.row;
  (menu->active).width = rVar6.width;
  (menu->active).page_rows = rVar6.page_rows;
  wVar1 = rVar6.row;
  wVar4 = rVar6.page_rows;
  if (menu->title != (char *)0x0) {
    wVar1 = wVar1 + L'\x02';
    (menu->active).row = wVar1;
    wVar4 = wVar4 + L'\xfffffffe';
    (menu->active).page_rows = wVar4;
    wVar5 = wVar5 + L'\x04';
    (menu->active).col = wVar5;
  }
  if (menu->header != (char *)0x0) {
    (menu->active).row = wVar1 + L'\x01';
    wVar4 = wVar4 + L'\xffffffff';
    (menu->active).page_rows = wVar4;
  }
  if (menu->prompt != (char *)0x0) {
    if (wVar4 < L'\x02') {
      sVar2 = strlen(menu->prompt);
      (menu->active).col = (int)sVar2 + wVar5 + 2;
      wVar3 = wVar3 - ((int)sVar2 + 2);
      (menu->active).width = wVar3;
    }
    else {
      wVar4 = wVar4 + L'\xffffffff';
      (menu->active).page_rows = wVar4;
    }
  }
  return L'\0' < wVar4 && L'\0' < wVar3;
}

Assistant:

static bool menu_calc_size(struct menu *menu)
{
	/* Calculate term-relative positions */
	menu->active = region_calculate(menu->boundary);

	if (menu->title) {
		menu->active.row += 2;
		menu->active.page_rows -= 2;
		menu->active.col += 4;
	}

	if (menu->header) {
		menu->active.row++;
		menu->active.page_rows--;
	}

	if (menu->prompt) {
		if (menu->active.page_rows > 1) {
			menu->active.page_rows--;
		} else {
			int offset = strlen(menu->prompt) + 2;
			menu->active.col += offset;
			menu->active.width -= offset;
		}
	}

	return (menu->active.width > 0 && menu->active.page_rows > 0);
}